

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::ChromeLatencyInfo::~ChromeLatencyInfo(ChromeLatencyInfo *this)

{
  ChromeLatencyInfo *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ChromeLatencyInfo_009c1ea0;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  std::
  vector<perfetto::protos::gen::ChromeLatencyInfo_ComponentInfo,_std::allocator<perfetto::protos::gen::ChromeLatencyInfo_ComponentInfo>_>
  ::~vector(&this->component_info_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

ChromeLatencyInfo::~ChromeLatencyInfo() = default;